

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O1

void initialize_random_artifacts(uint32_t randart_seed)

{
  _Bool **dest;
  artifact_upkeep *paVar1;
  bitflag *pbVar2;
  ushort uVar3;
  effect *effect1;
  effect *effect2;
  wchar_t wVar4;
  wchar_t wVar5;
  activation **ppaVar6;
  artifact *paVar7;
  char ***sections;
  _Bool _Var8;
  uint32_t uVar9;
  wchar_t wVar10;
  ang_file *f;
  long lVar11;
  char *pcVar12;
  object_kind *poVar13;
  wchar_t wVar14;
  int iVar15;
  int iVar16;
  wchar_t wVar17;
  wchar_t wVar18;
  activation *paVar19;
  char *file_name;
  ulong uVar20;
  artifact *art;
  activation *unaff_R15;
  byte bVar21;
  char word [1024];
  char fname [1024];
  char buf [1024];
  activation local_c38;
  undefined8 uStack_bf0;
  undefined8 local_be8;
  undefined8 uStack_be0;
  undefined8 local_bd8;
  undefined8 uStack_bd0;
  undefined8 local_bc8;
  char local_838 [1024];
  char local_438 [1032];
  
  bVar21 = 0;
  Rand_quick = true;
  Rand_value = randart_seed;
  path_build(local_838,0x400,ANGBAND_DIR_USER,"randart.txt");
  f = file_open(local_838,MODE_WRITE,FTYPE_TEXT);
  if (f == (ang_file *)0x0) {
    quit_fmt("Error - can\'t create %s.",local_838);
  }
  file_putf(f,"# Artifact file for random artifacts with seed %08x\n\n\n",randart_seed);
  a_info = (artifact *)mem_realloc(a_info,(ulong)((uint)z_info->a_max * 0x140) + 0x3200);
  aup_info = (artifact_upkeep *)mem_realloc(aup_info,(ulong)z_info->a_max * 8 + 0x140);
  iVar15 = 0;
  do {
    paVar7 = a_info;
    uVar3 = z_info->a_max;
    art = (artifact *)(a_info->flags + ((ulong)((uint)uVar3 * 0x140) - 0x3c));
    memset(art,0,0x140);
    paVar1 = aup_info + z_info->a_max;
    paVar1->aidx = 0;
    paVar1->created = false;
    paVar1->seen = false;
    paVar1->everseen = false;
    paVar1->field_0x7 = 0;
    aup_info[z_info->a_max].aidx = (uint)z_info->a_max;
    memset(art,0,0x140);
    do {
      do {
        uVar9 = Rand_div((uint)z_info->k_max);
      } while (k_info[(int)uVar9].name == (char *)0x0);
      poVar13 = k_info + (int)uVar9;
    } while (((poVar13->alloc_prob == L'\0') || (_Var8 = tval_can_be_artifact_k(poVar13), !_Var8))
            || (uVar9 = Rand_div((uint32_t)(100 / (long)poVar13->alloc_prob)), uVar9 != 0));
    art->tval = poVar13->tval;
    art->sval = poVar13->sval;
    wVar10 = (poVar13->to_h).base;
    art->to_h = (int16_t)((uint)(wVar10 - (wVar10 >> 0x1f)) >> 1);
    wVar10 = (poVar13->to_d).base;
    art->to_d = (int16_t)((uint)(wVar10 - (wVar10 >> 0x1f)) >> 1);
    wVar10 = (poVar13->to_a).base;
    art->to_a = (int16_t)((uint)(wVar10 - (wVar10 >> 0x1f)) >> 1);
    art->ac = (int16_t)poVar13->ac;
    art->dd = (uint8_t)poVar13->dd;
    art->ds = (uint8_t)poVar13->ds;
    if (L'ᎇ' < poVar13->cost) {
      art->cost = poVar13->cost;
    }
    art->weight = poVar13->weight;
    flag_copy(art->flags,poVar13->flags,6);
    lVar11 = 0;
    do {
      art->el_info[lVar11].res_level = poVar13->el_info[lVar11].res_level;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x1c);
    lVar11 = 0;
    do {
      *(short *)((long)art->modifiers + lVar11) = (short)(&poVar13->modifiers[0].base)[lVar11 * 2];
      lVar11 = lVar11 + 2;
    } while (lVar11 != 0x22);
    copy_slays(&art->slays,poVar13->slays);
    dest = &art->brands;
    copy_brands(dest,poVar13->brands);
    if (z_info->act_max == 0) {
      unaff_R15 = (activation *)0x0;
    }
    else {
      effect1 = poVar13->effect;
      lVar11 = 0;
      uVar20 = 0;
      do {
        effect2 = *(effect **)((long)&activations->effect + lVar11);
        if (effect2 == (effect *)0x0) {
          _Var8 = true;
        }
        else {
          ppaVar6 = &activations->next;
          _Var8 = effect_equal(effect1,effect2);
          if (!_Var8) {
            unaff_R15 = (activation *)((long)ppaVar6 + lVar11);
          }
        }
        if (_Var8 == false) goto LAB_0018afa8;
        uVar20 = uVar20 + 1;
        lVar11 = lVar11 + 0x48;
      } while (uVar20 < z_info->act_max);
      unaff_R15 = (activation *)0x0;
    }
LAB_0018afa8:
    art->activation = unaff_R15;
    wVar10 = (poVar13->time).dice;
    wVar14 = (poVar13->time).sides;
    wVar18 = (poVar13->time).m_bonus;
    (art->time).base = (poVar13->time).base;
    (art->time).dice = wVar10;
    (art->time).sides = wVar14;
    (art->time).m_bonus = wVar18;
    lVar11 = 0;
    do {
      pbVar2 = &paVar7->el_info[lVar11].flags + (uint)uVar3 * 0x140;
      *pbVar2 = *pbVar2 | 2;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 4);
    potential = L'ۖ';
    iVar16 = 0xe;
    unaff_R15 = &local_c38;
    do {
      uVar9 = Rand_div(0xf);
      if ((int)uVar9 < 2) break;
      potential = potential + L'Ǵ';
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    wVar10 = poVar13->power;
    wVar14 = potential - wVar10;
    if (wVar14 < L'ۗ') {
      wVar14 = L'ۖ';
    }
    max_potential = poVar13->base->potential;
    if (max_potential <= wVar14) {
      wVar14 = max_potential;
    }
    potential = wVar14;
    initial_potential = wVar14;
    art->cost = art->cost + wVar14 * 10;
    wVar4 = wVar14 / 100;
    wVar18 = poVar13->alloc_min;
    wVar5 = wVar18;
    if (wVar18 < wVar4) {
      wVar5 = wVar4;
    }
    wVar17 = L'\x05';
    if (L'\x0e' < wVar5) {
      if (wVar4 < wVar18) {
        wVar17 = wVar18 + L'\xfffffff6';
      }
      else {
        wVar17 = wVar4 + L'\xfffffff6';
      }
    }
    art->alloc_min = wVar17;
    wVar18 = (wVar17 - wVar18) + poVar13->alloc_max;
    if (L'~' < wVar18) {
      wVar18 = L'\x7f';
    }
    art->alloc_max = wVar18;
    wVar10 = (int)(10000 / (long)(wVar14 + wVar10)) * 100;
    art->alloc_prob = wVar10;
    wVar10 = wVar10 / poVar13->alloc_prob;
    if (L'\x1d' < wVar10) {
      wVar10 = L'\x1e';
    }
    art->alloc_prob = wVar10;
    choose_artifact_theme(art);
    haggle_till_done(art,(object *)0x0);
    uVar9 = Rand_div(100);
    if ((int)uVar9 < 5) {
      make_terrible(art,(object *)0x0);
    }
    final_check(art,(object *)0x0);
    paVar19 = art->activation;
    if ((paVar19 != (activation *)0x0) && (paVar19 != k_info[art->tval].activation)) {
      if ((paVar19->time).base == L'\0') {
        iVar16 = paVar19->power << 3;
        (art->time).base = iVar16;
        (art->time).dice = 1;
        (art->time).sides = iVar16;
      }
      else {
        wVar10 = (paVar19->time).dice;
        wVar14 = (paVar19->time).sides;
        wVar18 = (paVar19->time).m_bonus;
        (art->time).base = (paVar19->time).base;
        (art->time).dice = wVar10;
        (art->time).sides = wVar14;
        (art->time).m_bonus = wVar18;
      }
    }
    pcVar12 = "Random ";
    paVar19 = unaff_R15;
    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
      paVar19->next = *(activation **)pcVar12;
      pcVar12 = pcVar12 + ((ulong)bVar21 * -2 + 1) * 8;
      paVar19 = (activation *)((long)paVar19 + (ulong)bVar21 * -0x10 + 8);
    }
    pcVar12 = tval_find_name(art->tval);
    my_strcat((char *)unaff_R15,pcVar12,0x80);
    pcVar12 = format(" of power %d",(ulong)(uint)initial_potential);
    my_strcat((char *)unaff_R15,pcVar12,0x80);
    string_free(art->text);
    pcVar12 = string_make((char *)unaff_R15);
    art->text = pcVar12;
    sections = name_sections;
    wVar10 = Rand_div(max_potential);
    if ((wVar10 < initial_potential) && (uVar9 = Rand_div(2), uVar9 != 0)) {
      find_word_art_name[0] = 0;
      wVar10 = art->cost;
      _Var8 = tval_is_weapon_a(art);
      pcVar12 = "a_cursed.txt";
      if (_Var8) {
        pcVar12 = "w_cursed.txt";
      }
      file_name = "a_normal.txt";
      if (_Var8) {
        file_name = "w_normal.txt";
      }
      if (wVar10 == L'\0') {
        file_name = pcVar12;
      }
      get_rnd_line(file_name,find_word_art_name);
      my_strcpy((char *)unaff_R15,find_word_art_name,0x400);
      my_strcpy(local_438,(char *)unaff_R15,0x400);
    }
    else {
      randname_make(RANDNAME_TOLKIEN,5,9,(char *)unaff_R15,0x400,sections);
      my_strcap((char *)unaff_R15);
      uVar9 = Rand_div(3);
      if (uVar9 == 0) {
        pcVar12 = "\'%s\'";
      }
      else {
        pcVar12 = "of %s";
      }
      pcVar12 = format(pcVar12,unaff_R15);
      my_strcpy(local_438,pcVar12,0x400);
    }
    pcVar12 = string_make((char *)unaff_R15);
    art->name = pcVar12;
    art->aidx = (uint)z_info->a_max;
    local_bd8 = 0;
    uStack_bd0 = 0;
    local_be8 = 0;
    uStack_be0 = 0;
    local_c38.desc = (char *)0x0;
    uStack_bf0 = 0;
    local_c38.time.sides = L'\0';
    local_c38.time.m_bonus = L'\0';
    local_c38.message = (char *)0x0;
    local_c38.effect = (effect *)0x0;
    local_c38.time.base = L'\0';
    local_c38.time.dice = L'\0';
    local_c38.index = L'\0';
    local_c38.type = '\0';
    local_c38.aim = false;
    local_c38._22_2_ = 0;
    local_c38.power = L'\0';
    local_c38._28_4_ = 0;
    local_c38.next = (activation *)0x0;
    local_c38.name = (char *)0x0;
    local_bc8 = 0;
    poVar13 = lookup_kind(art->tval,art->sval);
    if (art->name != (char *)0x0) {
      file_putf(f,"# %s\n",art->text);
      file_putf(f,"name:%s\n",art->name);
      object_short_name((char *)unaff_R15,0x78,poVar13->name);
      pcVar12 = tval_find_name(art->tval);
      file_putf(f,"base-object:%s:%s\n",pcVar12,unaff_R15);
      if ((uint)z_info->ordinary_kind_max <= poVar13->kidx) {
        pcVar12 = attr_to_text(poVar13->d_attr);
        file_putf(f,"graphics:%c:%s\n",(ulong)(uint)poVar13->d_char,pcVar12);
      }
      file_putf(f,"level:%d\n",(ulong)(uint)art->level);
      file_putf(f,"weight:%d\n",(ulong)(uint)art->weight);
      file_putf(f,"cost:%d\n",(ulong)(uint)art->cost);
      file_putf(f,"alloc:%d:%d to %d\n",(ulong)(uint)art->alloc_prob,(ulong)(uint)art->alloc_min,
                (ulong)(uint)art->alloc_max);
      file_putf(f,"attack:%dd%d:%d:%d\n",(ulong)art->dd,(ulong)art->ds,(ulong)(uint)(int)art->to_h,
                (ulong)(uint)(int)art->to_d);
      file_putf(f,"armor:%d:%d\n",(ulong)(uint)(int)art->ac,(ulong)(uint)(int)art->to_a);
      write_flags(f,"flags:",art->flags,6,(char **)write_randart_file_entry_obj_flags);
      write_mods(f,art->modifiers);
      write_elements(f,art->el_info);
      if ((art->slays != (_Bool *)0x0) && (1 < z_info->slay_max)) {
        uVar20 = 1;
        unaff_R15 = (activation *)0x38;
        do {
          if (art->slays[uVar20] == true) {
            file_putf(f,"slay:%s\n",*(undefined8 *)((long)unaff_R15 + (long)&slays->code));
          }
          uVar20 = uVar20 + 1;
          unaff_R15 = (activation *)((long)unaff_R15 + 0x38);
        } while (uVar20 < z_info->slay_max);
      }
      if ((*dest != (_Bool *)0x0) && (1 < z_info->brand_max)) {
        uVar20 = 1;
        unaff_R15 = (activation *)0x30;
        do {
          if ((*dest)[uVar20] == true) {
            file_putf(f,"brand:%s\n",*(undefined8 *)((long)unaff_R15 + (long)&brands->code));
          }
          uVar20 = uVar20 + 1;
          unaff_R15 = (activation *)((long)unaff_R15 + 0x30);
        } while (uVar20 < z_info->brand_max);
      }
      if ((art->curses != (int *)0x0) && (1 < z_info->curse_max)) {
        uVar20 = 1;
        unaff_R15 = (activation *)0x10;
        do {
          if (art->curses[uVar20] != 0) {
            file_putf(f,"curse:%s:%d\n",
                      *(undefined8 *)(curses->conflict_flags + (long)unaff_R15 * 4 + -0x28));
          }
          uVar20 = uVar20 + 1;
          unaff_R15 = (activation *)((long)&unaff_R15->name + 6);
        } while (uVar20 < z_info->curse_max);
      }
      if (art->activation == (activation *)0x0) {
        if (poVar13->activation != (activation *)0x0) {
          file_putf(f,"act:%s\n",poVar13->activation->name);
          wVar10 = (poVar13->time).base;
          wVar14 = (poVar13->time).dice;
          wVar18 = (poVar13->time).sides;
          goto LAB_0018b6be;
        }
      }
      else {
        file_putf(f,"act:%s\n",art->activation->name);
        wVar10 = (art->time).base;
        wVar14 = (art->time).dice;
        wVar18 = (art->time).sides;
LAB_0018b6be:
        file_putf(f,"time:%d+%dd%d\n",(ulong)(uint)wVar10,(ulong)(uint)wVar14,(ulong)(uint)wVar18);
      }
      file_putf(f,"desc:%s\n",art->text);
      file_putf(f,"\n");
    }
    z_info->a_max = z_info->a_max + 1;
    iVar15 = iVar15 + 1;
    if (iVar15 == 0x28) {
      _Var8 = file_close(f);
      if (!_Var8) {
        quit_fmt("Error - can\'t close %s.",local_838);
      }
      return;
    }
  } while( true );
}

Assistant:

void initialize_random_artifacts(uint32_t randart_seed)
{
	char fname[1024];
	ang_file *randart_file = NULL;
	int i;

	/* Prepare to use the Angband "simple" RNG. */
	Rand_value = randart_seed;
	Rand_quick = true;

	/* Open the file, write a header */
	path_build(fname, sizeof(fname), ANGBAND_DIR_USER, "randart.txt");
	randart_file = file_open(fname, MODE_WRITE, FTYPE_TEXT);
	if (!randart_file) {
		quit_fmt("Error - can't create %s.", fname);
	}
	file_putf(randart_file,
			  "# Artifact file for random artifacts with seed %08x\n\n\n",
			  randart_seed);

	/* Initialize, name and write artifacts to the file */
	a_info = mem_realloc(a_info,
		(z_info->a_max + ART_NUM_RANDOM) * sizeof(*a_info));
	aup_info = mem_realloc(aup_info,
		(z_info->a_max + ART_NUM_RANDOM) * sizeof(*aup_info));
	for (i = 0; i < ART_NUM_RANDOM; i++) {
		/* Extend the artifact array with a zero entry */
		struct artifact *art;
		art = &a_info[z_info->a_max];
		memset(art, 0, sizeof(*art));
		memset(&aup_info[z_info->a_max], 0, sizeof(*aup_info));
		aup_info[z_info->a_max].aidx = z_info->a_max;

		/* Design the artifact, storing information as we go along. */
		design_random_artifact(art);
		art->aidx = z_info->a_max;

		/* Write the entry to the randart file */
		write_randart_file_entry(randart_file, art);

		z_info->a_max += 1;
	}

	/* Close the file */
	if (!file_close(randart_file)) {
		quit_fmt("Error - can't close %s.", fname);
	}
}